

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.cpp
# Opt level: O2

string * hmac::get_hmac(string *__return_storage_ptr__,string *key_input,string *msg,TypeHash type,
                       bool is_hex,bool is_upper)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_t i;
  ulong uVar2;
  string ikeypad;
  string key;
  string okeypad;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (type < (SHA512|SHA256)) {
    uVar1 = *(ulong *)(&DAT_00107870 + (ulong)type * 8);
    std::__cxx11::string::string((string *)&local_90,(string *)key_input);
    if (uVar1 < local_90._M_string_length) {
      get_hash(&local_110,&local_90,type);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    if (local_90._M_string_length < uVar1) {
      std::__cxx11::string::resize((ulong)&local_90,(char)uVar1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&local_110);
    std::__cxx11::string::reserve((ulong)&local_70);
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      std::__cxx11::string::push_back((char)&local_110);
      std::__cxx11::string::push_back((char)&local_70);
    }
    if (is_hex) {
      std::operator+(&local_50,&local_110,msg);
      get_hash(&local_f0,&local_50,type);
      std::operator+(&local_d0,&local_70,&local_f0);
      get_hash(&local_b0,&local_d0,type);
      to_hex(__return_storage_ptr__,&local_b0,is_upper);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      this = &local_50;
    }
    else {
      std::operator+(&local_f0,&local_110,msg);
      get_hash(&local_d0,&local_f0,type);
      std::operator+(&local_b0,&local_70,&local_d0);
      get_hash(__return_storage_ptr__,&local_b0,type);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      this = &local_f0;
    }
    std::__cxx11::string::~string((string *)this);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_hmac(const std::string& key_input, const std::string &msg, TypeHash type, bool is_hex, bool is_upper) {
        size_t block_size = 0;
        switch(type) {
        case TypeHash::SHA1:
            block_size = hmac_hash::SHA1::BLOCK_SIZE;
            break;
        case TypeHash::SHA256:
            block_size = hmac_hash::SHA256::SHA224_256_BLOCK_SIZE;
            break;
        case TypeHash::SHA512:
            block_size = hmac_hash::SHA512::SHA384_512_BLOCK_SIZE;
            break;
        default:
            return std::string();
        };

        std::string key = key_input;
        
        if(key.size() > block_size) {
            /* If key length > block size, hash it and pad with zeros to block size */
            key = get_hash(key, type);
        }
        if(key.size() < block_size) {
            /* Pad key with zeros if it's shorter than block size */
            key.resize(block_size, '\0');
        }
        
        /* If key length == block size, use it as is */
        std::string ikeypad;
        std::string okeypad;
        
        ikeypad.reserve(block_size);
        okeypad.reserve(block_size);
        
        for(size_t i = 0; i < block_size; ++i) {
            ikeypad.push_back(0x36 ^ key[i]);
            okeypad.push_back(0x5c ^ key[i]);
        }

        return is_hex 
            ? to_hex(get_hash(okeypad + get_hash(ikeypad + msg, type), type), is_upper) 
            : get_hash(okeypad + get_hash(ikeypad + msg, type), type);
    }